

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Logger::register_client(Logger *this,LoggerClient *c)

{
  int *piVar1;
  SmartPointer<GEO::LoggerClient> local_10;
  
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
  }
  local_10.pointer_ = c;
  std::
  _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,GEO::SmartPointer<GEO::LoggerClient>,std::_Identity<GEO::SmartPointer<GEO::LoggerClient>>,std::less<GEO::SmartPointer<GEO::LoggerClient>>,std::allocator<GEO::SmartPointer<GEO::LoggerClient>>>
  ::_M_insert_unique<GEO::SmartPointer<GEO::LoggerClient>>
            ((_Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,GEO::SmartPointer<GEO::LoggerClient>,std::_Identity<GEO::SmartPointer<GEO::LoggerClient>>,std::less<GEO::SmartPointer<GEO::LoggerClient>>,std::allocator<GEO::SmartPointer<GEO::LoggerClient>>>
              *)&this->clients_,&local_10);
  SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_10);
  return;
}

Assistant:

void Logger::register_client(LoggerClient* c) {
        clients_.insert(c);
    }